

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::blend_equation_advanced
               (NegativeTestContext *ctx)

{
  ostream *poVar1;
  long lVar2;
  allocator<char> local_1c9;
  string local_1c8;
  ostringstream source;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,
             "GL_KHR_blend_equation_advanced features require enabling the extension in 310 es shaders."
             ,&local_1c9);
  NegativeTestContext::beginSection(ctx,(string *)&source);
  std::__cxx11::string::~string((string *)&source);
  for (lVar2 = 0; lVar2 != 0x3c; lVar2 = lVar2 + 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
    poVar1 = std::operator<<((ostream *)&source,"#version 310 es\nlayout(");
    poVar1 = std::operator<<(poVar1,(char *)((long)&
                                                  _ZZN4deqp6gles3110Functional18NegativeTestShared12_GLOBAL__N_123blend_equation_advancedERNS2_19NegativeTestContextEE12s_qualifiers_rel
                                            + (long)*(int *)((long)&
                                                  _ZZN4deqp6gles3110Functional18NegativeTestShared12_GLOBAL__N_123blend_equation_advancedERNS2_19NegativeTestContextEE12s_qualifiers_rel
                                                  + lVar2)));
    std::operator<<(poVar1,") out;\nvoid main()\n{\n}\n");
    std::__cxx11::stringbuf::str();
    verifyShader(ctx,SHADERTYPE_FRAGMENT,&local_1c8,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void blend_equation_advanced (NegativeTestContext& ctx)
{
	static const char* const s_qualifiers[] =
	{
		"blend_support_multiply",
		"blend_support_screen",
		"blend_support_overlay",
		"blend_support_darken",
		"blend_support_lighten",
		"blend_support_colordodge",
		"blend_support_colorburn",
		"blend_support_hardlight",
		"blend_support_softlight",
		"blend_support_difference",
		"blend_support_exclusion",
		"blend_support_hsl_hue",
		"blend_support_hsl_saturation",
		"blend_support_hsl_color",
		"blend_support_hsl_luminosity",
	};

	ctx.beginSection("GL_KHR_blend_equation_advanced features require enabling the extension in 310 es shaders.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_qualifiers); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"layout(" << s_qualifiers[ndx] << ") out;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}